

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> * __thiscall
FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor>::file_info
          (FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> *this,CommandOptions *Options
          ,char *type_string,IFileReaderFactory *fileReaderFactory,FILE *stream)

{
  MXFReader Reader;
  MyVideoDescriptor Desc;
  WriterInfo WI;
  allocator<char> local_1a1;
  undefined1 local_1a0 [16];
  VideoDescriptor local_190;
  WriterInfo local_148;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::MPEG2::MXFReader::MXFReader((MXFReader *)local_1a0,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_1a0 + 0x10),Options->filenames[0],&local_1a1);
      ASDCP::MPEG2::MXFReader::OpenRead((string *)&local_148);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_148);
      Kumu::Result_t::~Result_t((Result_t *)&local_148);
      std::__cxx11::string::~string((string *)(local_1a0 + 0x10));
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1a0);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_1a0);
        }
        ASDCP::WriterInfo::WriterInfo(&local_148);
        ASDCP::MPEG2::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        ASDCP::WriterInfoDump(&local_148,(_IO_FILE *)stream);
        local_190.EditRate = (Rational)0x0;
        local_190.SampleRate = (Rational)0x0;
        local_190.AspectRatio = (Rational)0x0;
        MyVideoDescriptor::FillDescriptor
                  ((MyVideoDescriptor *)(local_1a0 + 0x10),(MXFReader *)local_1a0);
        ASDCP::MPEG2::VideoDescriptorDump((VideoDescriptor *)(local_1a0 + 0x10),(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::MPEG2::MXFReader::DumpIndex((_IO_FILE *)local_1a0);
        }
        ASDCP::WriterInfo::~WriterInfo(&local_148);
      }
      ASDCP::MPEG2::MXFReader::~MXFReader((MXFReader *)local_1a0);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::MPEG2::MXFReader, MyVideoDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::MPEG2::MXFReader, DescriptorT = MyVideoDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }